

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_fstore(ExecutionEngine *this)

{
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  ushort uVar3;
  Value variableValue;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  if (variableValue.type != FLOAT) {
    __assert_fail("value.type == ValueType::FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x4bc,"void ExecutionEngine::i_fstore()");
  }
  puVar2 = Frame::getCode(this_01,this_01->pc);
  uVar3 = (ushort)puVar2[1];
  if (this->_isWide == true) {
    uVar3 = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  else {
    this_01->pc = this_01->pc + 2;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  if ((short)uVar3 < (short)uVar1) {
    Frame::changeLocalVariable(this_01,variableValue,(int)(short)uVar3);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x4cb,"void ExecutionEngine::i_fstore()");
}

Assistant:

void ExecutionEngine::i_fstore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::FLOAT);

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > index));
	topFrame->changeLocalVariable(value, index);
}